

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ProgramBinaryUniformResetCase::test(ProgramBinaryUniformResetCase *this)

{
  CallLogWrapper *this_00;
  TestLog *log;
  RenderContext *context;
  undefined1 auVar1 [8];
  int iVar2;
  deUint32 dVar3;
  GLenum err;
  pointer pcVar4;
  undefined4 extraout_var;
  TestError *this_01;
  long lVar5;
  string fragSrc;
  ProgramBinary binary;
  string vertSrc;
  deUint16 quadIndices [6];
  float position [16];
  size_type __dnew;
  ShaderProgram program;
  ProgramSources sources;
  value_type local_458;
  ProgramBinary local_438;
  value_type local_418;
  undefined8 local_3f8;
  undefined4 local_3f0;
  undefined1 local_3e8 [8];
  long *local_3e0;
  undefined8 *local_3d8;
  long local_3d0 [2];
  int local_3c0;
  long *local_3b8;
  undefined8 local_3b0;
  long local_3a8;
  undefined2 local_3a0;
  undefined1 local_39e;
  undefined4 local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined1 local_358 [8];
  _Alloc_hider local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  int local_330;
  VertexArrayPointer local_328 [2];
  ios_base local_2e0 [272];
  ShaderProgram local_1d0;
  ProgramSources local_100;
  
  log = ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  local_358 = (undefined1  [8])0xb0;
  pcVar4 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)local_358);
  auVar1 = local_358;
  local_418.field_2._M_allocated_capacity = (size_type)local_358;
  local_418._M_dataplus._M_p = pcVar4;
  memcpy(pcVar4,
         "#version 300 es\nuniform bool u_boolVar;\nuniform highp int u_intVar;\nuniform highp float u_floatVar;\n\nin highp vec4 a_position;\n\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
         ,0xb0);
  local_418._M_string_length = (size_type)auVar1;
  pcVar4[(long)auVar1] = '\0';
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  local_358 = (undefined1  [8])0x114;
  pcVar4 = (pointer)std::__cxx11::string::_M_create((ulong *)&local_458,(ulong)local_358);
  auVar1 = local_358;
  local_458.field_2._M_allocated_capacity = (size_type)local_358;
  local_458._M_dataplus._M_p = pcVar4;
  memcpy(pcVar4,
         "#version 300 es\nuniform bool u_boolVar;\nuniform highp int u_intVar;\nuniform highp float u_floatVar;\n\nlayout(location = 0) out mediump vec4 o_fragColor;\n\nvoid main (void)\n{\n\tmediump float refAll = float(u_boolVar) + float(u_intVar) + u_floatVar;\n\to_fragColor = vec4(refAll);\n}\n"
         ,0x114);
  local_458._M_string_length = (size_type)auVar1;
  pcVar4[(long)auVar1] = '\0';
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources,&local_418);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + 1,&local_458);
  glu::ShaderProgram::ShaderProgram
            (&local_1d0,((this->super_ProgramBinaryCase).super_TestCase.m_context)->m_renderCtx,
             &local_100);
  glu::operator<<(log,&local_1d0);
  if (local_1d0.m_program.m_info.linkOk != false) {
    local_438.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_438.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_438.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ProgramBinaryCase::getProgramBinary
              (&this->super_ProgramBinaryCase,&local_438,local_1d0.m_program.m_program);
    ProgramBinaryCase::verifyProgramBinary(&this->super_ProgramBinaryCase,&local_438);
    setUniformsRandom(this,&local_1d0);
    local_358 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_350);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_350,"Rendering test image and reloading binary",0x29);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_358,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_350);
    std::ios_base::~ios_base(local_2e0);
    dVar3 = local_1d0.m_program.m_program;
    context = ((this->super_ProgramBinaryCase).super_TestCase.m_context)->m_renderCtx;
    iVar2 = (*context->_vptr_RenderContext[3])(context);
    local_368 = 0x3f8000003f800000;
    uStack_360 = 0x3f80000000000000;
    local_378 = 0xbf8000003f800000;
    uStack_370 = 0x3f80000000000000;
    local_388 = 0x3f800000bf800000;
    uStack_380 = 0x3f80000000000000;
    local_398 = 0xbf800000;
    uStack_394 = 0xbf800000;
    uStack_390 = 0;
    uStack_38c = 0x3f800000;
    local_3f8 = 0x2000200010000;
    local_3f0 = 0x30001;
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1680))(dVar3);
    local_3a8 = 0x697469736f705f61;
    local_3a0 = 0x6e6f;
    local_3b0 = 10;
    local_39e = 0;
    local_3e8._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
    local_3e0 = local_3d0;
    local_3b8 = &local_3a8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_3e0,&local_3a8);
    local_3c0 = 0;
    local_358._0_4_ = local_3e8._0_4_;
    local_350._M_p = (pointer)&local_340;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_350,local_3e0,(long)local_3d8 + (long)local_3e0);
    local_330 = local_3c0;
    local_328[0].componentType = VTX_COMP_FLOAT;
    local_328[0].convert = VTX_COMP_CONVERT_NONE;
    local_328[0].numComponents = 4;
    local_328[0].numElements = 4;
    local_328[0].stride = 0;
    local_328[0].data = &local_398;
    if (local_3e0 != local_3d0) {
      operator_delete(local_3e0,local_3d0[0] + 1);
    }
    if (local_3b8 != &local_3a8) {
      operator_delete(local_3b8,local_3a8 + 1);
    }
    local_3e8._0_4_ = PRIMITIVETYPE_TRIANGLES;
    local_3e8._4_4_ = 6;
    local_3e0 = (long *)CONCAT44(local_3e0._4_4_,INDEXTYPE_UINT16);
    local_3d8 = &local_3f8;
    glu::draw(context,dVar3,1,(VertexArrayBinding *)local_358,(PrimitiveList *)local_3e8,
              (DrawUtilCallback *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_p != &local_340) {
      operator_delete(local_350._M_p,local_340._M_allocated_capacity + 1);
    }
    dVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
    glu::checkError(dVar3,"Draw test quad",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                    ,0xd3);
    this_00 = &(this->super_ProgramBinaryCase).super_CallLogWrapper;
    glu::CallLogWrapper::glProgramBinary
              (this_00,local_1d0.m_program.m_program,local_438.format,
               local_438.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (int)local_438.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
               (int)local_438.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    err = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(err,"Failed to load program binary.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
                    ,0x498);
    verifyUniformsReset(this,&local_1d0);
    if (local_438.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_438.data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_438.data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_438.data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    glu::ShaderProgram::~ShaderProgram(&local_1d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_100.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_100.attribLocationBindings);
    lVar5 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_100.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar5));
      lVar5 = lVar5 + -0x18;
    } while (lVar5 != -0x18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._M_dataplus._M_p != &local_458.field_2) {
      operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Couldn\'t build program","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderApiTests.cpp"
             ,0x557);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void test (void)
	{
		TestLog&					log		= m_testCtx.getLog();

		const std::string			vertSrc	= getShaderSource(glu::SHADERTYPE_VERTEX);
		const std::string			fragSrc	= getShaderSource(glu::SHADERTYPE_FRAGMENT);

		const glu::ProgramSources	sources	= glu::makeVtxFragSources(vertSrc, fragSrc);

		glu::ShaderProgram			program	(m_context.getRenderContext(), sources);

		log << program;

		TCU_CHECK_MSG(program.isOk(), "Couldn't build program");

		{
			ProgramBinary binary;

			getProgramBinary(binary, program.getProgram());
			verifyProgramBinary(binary);

			setUniformsRandom(program);

			log << TestLog::Message << "Rendering test image and reloading binary" << TestLog::EndMessage;

			drawWithProgram(m_context.getRenderContext(), program.getProgram());
			loadProgramBinary(binary, program.getProgram());

			verifyUniformsReset(program);
		}
	}